

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O1

int verifyMerkleTree(tree_t *tree,uint8_t **leafData,uint8_t *salt,picnic_instance_t *params)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = tree->numLeaves;
  if (uVar3 != 0) {
    uVar1 = tree->numNodes;
    uVar2 = uVar1 * 2 + uVar3 * -2 + 1;
    uVar4 = 0;
    do {
      if (leafData[uVar4] != (uint8_t *)0x0) {
        if ((tree->haveNodeExists[uVar2 >> 6] >> ((ulong)uVar2 & 0x3f) & 1) != 0) {
          return -1;
        }
        memcpy(tree->nodes + ((uVar1 - uVar3) + (int)uVar4) * tree->dataSize,leafData[uVar4],
               (ulong)tree->dataSize);
        tree->haveNodeExists[uVar2 >> 6] =
             tree->haveNodeExists[uVar2 >> 6] | 1L << ((ulong)uVar2 & 0x3f);
      }
      uVar4 = uVar4 + 1;
      uVar2 = uVar2 + 2;
    } while (uVar4 < tree->numLeaves);
  }
  for (uVar3 = tree->numNodes; uVar3 != 0; uVar3 = uVar3 - 1) {
    computeParentHash(tree,uVar3,salt,params);
  }
  return (((uint)*tree->haveNodeExists >> 1 & 1) != 0) - 1;
}

Assistant:

int verifyMerkleTree(tree_t* tree, /* uint16_t* missingLeaves, size_t missingLeavesSize, */
                     uint8_t** leafData, uint8_t* salt, const picnic_instance_t* params) {
  unsigned int firstLeaf = tree->numNodes - tree->numLeaves;

  /* Copy the leaf data, where we have it. The actual data being committed to has already been
   * hashed, according to the spec. */
  for (unsigned int i = 0; i < tree->numLeaves; i++) {
    if (leafData[i] != NULL) {
      if (haveNode(tree, firstLeaf + i)) {
        return -1; /* A leaf was assigned from the prover for a node we've recomputed */
      }

      memcpy(&tree->nodes[(firstLeaf + i) * tree->dataSize], leafData[i], tree->dataSize);
      markNode(tree, firstLeaf + i);
    }
  }

  /* At this point the tree has some of the leaves, and some intermediate nodes
   * Work up the tree, computing all nodes we don't have that are missing. */
  for (unsigned int i = tree->numNodes; i > 0; i--) {
    computeParentHash(tree, i, salt, params);
  }

  /* Fail if the root was not computed. */
  if (!haveNode(tree, 0)) {
    return -1;
  }

  return 0;
}